

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3DoclistOrMerge(int bDescDoclist,char *a1,int n1,char *a2,int n2,char **paOut,int *pnOut)

{
  long lVar1;
  undefined4 uVar2;
  char **pp;
  char **pp_00;
  char **ppPoslist;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  int in_EDI;
  int in_R8D;
  undefined8 *in_R9;
  long in_FS_OFFSET;
  int *in_stack_00000008;
  sqlite3_int64 iDiff;
  char *aOut;
  char *pEnd2;
  char *pEnd1;
  int rc;
  int bFirstOut;
  char *p;
  char *p2;
  char *p1;
  sqlite3_int64 iPrev;
  sqlite3_int64 i2;
  sqlite3_int64 i1;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 uVar3;
  undefined3 uVar4;
  int in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  char **pp_01;
  int bDescIdx;
  int local_74;
  int local_40;
  char **local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_74 = 0;
  pp = (char **)(in_RSI + in_EDX);
  pp_00 = (char **)(in_RCX + in_R8D);
  *in_R9 = 0;
  *in_stack_00000008 = 0;
  local_38 = (char **)sqlite3_malloc64(CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                                      );
  if (local_38 == (char **)0x0) {
    local_40 = 7;
  }
  else {
    pp_01 = local_38;
    fts3GetDeltaVarint3(local_38,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                        (sqlite3_int64 *)
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    fts3GetDeltaVarint3(pp_01,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                        (sqlite3_int64 *)
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    while( true ) {
      uVar4 = (undefined3)in_stack_ffffffffffffff64;
      in_stack_ffffffffffffff64 = CONCAT13(1,uVar4);
      if (in_RSI == 0) {
        in_stack_ffffffffffffff64 = CONCAT13(in_RCX != 0,uVar4);
      }
      if ((char)((uint)in_stack_ffffffffffffff64 >> 0x18) == '\0') break;
      uVar2 = 1;
      if (in_EDI != 0) {
        uVar2 = 0xffffffff;
      }
      uVar3 = 0;
      ppPoslist = (char **)0x0;
      bDescIdx = (int)((ulong)pp_00 >> 0x20);
      if ((in_RCX == 0) || (in_RSI == 0)) {
        if (in_RCX == 0) {
          fts3PutDeltaVarint3(pp,bDescIdx,(sqlite3_int64 *)pp_01,(int *)0x0,
                              CONCAT44(in_stack_ffffffffffffff64,uVar2));
          fts3PoslistCopy(pp_01,ppPoslist);
          fts3GetDeltaVarint3(pp_01,(char *)ppPoslist,in_stack_ffffffffffffff64,
                              (sqlite3_int64 *)CONCAT44(uVar3,in_stack_ffffffffffffff58));
        }
        else {
          fts3PutDeltaVarint3(pp,bDescIdx,(sqlite3_int64 *)pp_01,(int *)0x0,
                              CONCAT44(in_stack_ffffffffffffff64,uVar2));
          fts3PoslistCopy(pp_01,ppPoslist);
          fts3GetDeltaVarint3(pp_01,(char *)ppPoslist,in_stack_ffffffffffffff64,
                              (sqlite3_int64 *)CONCAT44(uVar3,in_stack_ffffffffffffff58));
        }
      }
      else {
        fts3PutDeltaVarint3(pp,bDescIdx,(sqlite3_int64 *)pp_01,(int *)0x0,
                            CONCAT44(in_stack_ffffffffffffff64,uVar2));
        local_74 = fts3PoslistMerge(pp_00,pp_01,ppPoslist);
        if (local_74 != 0) break;
        fts3GetDeltaVarint3(pp_01,(char *)ppPoslist,in_stack_ffffffffffffff64,
                            (sqlite3_int64 *)CONCAT44(uVar3,in_stack_ffffffffffffff58));
        fts3GetDeltaVarint3(pp_01,(char *)ppPoslist,in_stack_ffffffffffffff64,
                            (sqlite3_int64 *)CONCAT44(uVar3,in_stack_ffffffffffffff58));
      }
    }
    if (local_74 == 0) {
      memset(local_38,0,8);
    }
    else {
      sqlite3_free((void *)0x24f041);
      pp_01 = (char **)0x0;
      local_38 = (char **)0x0;
    }
    *in_R9 = pp_01;
    *in_stack_00000008 = (int)local_38 - (int)pp_01;
    local_40 = local_74;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_40;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3DoclistOrMerge(
  int bDescDoclist,               /* True if arguments are desc */
  char *a1, int n1,               /* First doclist */
  char *a2, int n2,               /* Second doclist */
  char **paOut, int *pnOut        /* OUT: Malloc'd doclist */
){
  int rc = SQLITE_OK;
  sqlite3_int64 i1 = 0;
  sqlite3_int64 i2 = 0;
  sqlite3_int64 iPrev = 0;
  char *pEnd1 = &a1[n1];
  char *pEnd2 = &a2[n2];
  char *p1 = a1;
  char *p2 = a2;
  char *p;
  char *aOut;
  int bFirstOut = 0;

  *paOut = 0;
  *pnOut = 0;

  /* Allocate space for the output. Both the input and output doclists
  ** are delta encoded. If they are in ascending order (bDescDoclist==0),
  ** then the first docid in each list is simply encoded as a varint. For
  ** each subsequent docid, the varint stored is the difference between the
  ** current and previous docid (a positive number - since the list is in
  ** ascending order).
  **
  ** The first docid written to the output is therefore encoded using the
  ** same number of bytes as it is in whichever of the input lists it is
  ** read from. And each subsequent docid read from the same input list
  ** consumes either the same or less bytes as it did in the input (since
  ** the difference between it and the previous value in the output must
  ** be a positive value less than or equal to the delta value read from
  ** the input list). The same argument applies to all but the first docid
  ** read from the 'other' list. And to the contents of all position lists
  ** that will be copied and merged from the input to the output.
  **
  ** However, if the first docid copied to the output is a negative number,
  ** then the encoding of the first docid from the 'other' input list may
  ** be larger in the output than it was in the input (since the delta value
  ** may be a larger positive integer than the actual docid).
  **
  ** The space required to store the output is therefore the sum of the
  ** sizes of the two inputs, plus enough space for exactly one of the input
  ** docids to grow.
  **
  ** A symetric argument may be made if the doclists are in descending
  ** order.
  */
  aOut = sqlite3_malloc64((i64)n1+n2+FTS3_VARINT_MAX-1+FTS3_BUFFER_PADDING);
  if( !aOut ) return SQLITE_NOMEM;

  p = aOut;
  fts3GetDeltaVarint3(&p1, pEnd1, 0, &i1);
  fts3GetDeltaVarint3(&p2, pEnd2, 0, &i2);
  while( p1 || p2 ){
    sqlite3_int64 iDiff = DOCID_CMP(i1, i2);

    if( p2 && p1 && iDiff==0 ){
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i1);
      rc = fts3PoslistMerge(&p, &p1, &p2);
      if( rc ) break;
      fts3GetDeltaVarint3(&p1, pEnd1, bDescDoclist, &i1);
      fts3GetDeltaVarint3(&p2, pEnd2, bDescDoclist, &i2);
    }else if( !p2 || (p1 && iDiff<0) ){
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i1);
      fts3PoslistCopy(&p, &p1);
      fts3GetDeltaVarint3(&p1, pEnd1, bDescDoclist, &i1);
    }else{
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i2);
      fts3PoslistCopy(&p, &p2);
      fts3GetDeltaVarint3(&p2, pEnd2, bDescDoclist, &i2);
    }

    assert( (p-aOut)<=((p1?(p1-a1):n1)+(p2?(p2-a2):n2)+FTS3_VARINT_MAX-1) );
  }

  if( rc!=SQLITE_OK ){
    sqlite3_free(aOut);
    p = aOut = 0;
  }else{
    assert( (p-aOut)<=n1+n2+FTS3_VARINT_MAX-1 );
    memset(&aOut[(p-aOut)], 0, FTS3_BUFFER_PADDING);
  }
  *paOut = aOut;
  *pnOut = (int)(p-aOut);
  return rc;
}